

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

VisitReturn __thiscall
QMakeEvaluator::evaluateExpandFunction
          (QMakeEvaluator *this,ProKey *func,ushort **tokPtr,ProStringList *ret)

{
  Span *pSVar1;
  char16_t *pcVar2;
  Span *pSVar3;
  VisitReturn VVar4;
  VisitReturn VVar5;
  CutResult CVar6;
  QChar QVar7;
  ulong uVar8;
  int iVar9;
  QArrayData *pQVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QAnyStringView QVar12;
  QStringView QVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  QString local_a0;
  QArrayData *local_88;
  undefined8 *local_80;
  QArrayData *local_70;
  undefined8 *local_68;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar14 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constFindImpl<ProKey>
                     ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)(QMakeInternal::statics + 0x240)
                      ,func);
  if (cVar14.i.d == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0 &&
      cVar14.i.bucket == 0) {
    cVar15 = QHash<ProKey,_ProFunctionDef>::constFindImpl<ProKey>
                       (&(this->m_functionDefs).replaceFunctions,func);
    if (cVar15.i.d == (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x0 &&
        cVar15.i.bucket == 0) {
      skipExpression(this,tokPtr);
      QVar11.m_data = (storage_type *)0x2a;
      QVar11.m_size = (qsizetype)&local_70;
      QString::fromLatin1(QVar11);
      pcVar2 = (func->super_ProString).m_string.d.ptr;
      local_58.d = (Data *)(long)(func->super_ProString).m_offset;
      local_88 = (QArrayData *)(long)(func->super_ProString).m_length;
      CVar6 = QtPrivate::QContainerImplHelper::mid
                        ((func->super_ProString).m_string.d.size,(qsizetype *)&local_58,
                         (qsizetype *)&local_88);
      QVar7.ucs = (char16_t)local_88;
      iVar9 = (int)pcVar2 + (int)local_58.d * 2;
      if (CVar6 == Null) {
        QVar7.ucs = L'\0';
        iVar9 = 0;
      }
      QVar12.m_size = (size_t)&local_70;
      QVar12.field_0.m_data = &local_58;
      QString::arg_impl(QVar12,iVar9,QVar7);
      message(this,0x310,(QString *)&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,0x10);
        }
      }
      VVar5 = ReturnFalse;
    }
    else {
      local_58.d = (Data *)0x0;
      local_58.ptr = (ProString *)0x0;
      local_58.size = 0;
      VVar4 = prepareFunctionArgs(this,tokPtr,(QList<ProStringList> *)&local_58);
      VVar5 = ReturnError;
      if (VVar4 != ReturnError) {
        if (this->m_debugLevel != 0) {
          local_70 = (QArrayData *)(long)(func->super_ProString).m_offset;
          local_88 = (QArrayData *)(long)(func->super_ProString).m_length;
          CVar6 = QtPrivate::QContainerImplHelper::mid
                            ((func->super_ProString).m_string.d.size,(qsizetype *)&local_70,
                             (qsizetype *)&local_88);
          pQVar10 = local_88;
          if (CVar6 == Null) {
            pQVar10 = (QArrayData *)0x0;
          }
          QVar13.m_data = (storage_type_conflict *)pQVar10;
          QVar13.m_size = (qsizetype)&local_70;
          QtPrivate::convertToLocal8Bit(QVar13);
          if (local_68 == (undefined8 *)0x0) {
            local_68 = &QByteArray::_empty;
          }
          formatValueListList(&local_a0,(QList<ProStringList> *)&local_58);
          QString::toLocal8Bit_helper((QChar *)&local_88,(longlong)local_a0.d.ptr);
          if (local_80 == (undefined8 *)0x0) {
            local_80 = &QByteArray::_empty;
          }
          traceMsgInternal(this,"calling $$%s(%s)",local_68,local_80);
          if (local_88 != (QArrayData *)0x0) {
            LOCK();
            (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_88,1,0x10);
            }
          }
          if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_70 != (QArrayData *)0x0) {
            LOCK();
            (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_70,1,0x10);
            }
          }
        }
        pSVar3 = (cVar15.i.d)->spans;
        uVar8 = cVar15.i.bucket >> 7;
        VVar5 = evaluateFunction(this,(ProFunctionDef *)
                                      (pSVar3[uVar8].entries
                                       [pSVar3[uVar8].offsets[(uint)cVar15.i.bucket & 0x7f]].storage
                                       .data + 0x30),(QList<ProStringList> *)&local_58,ret);
      }
      QArrayDataPointer<ProStringList>::~QArrayDataPointer
                ((QArrayDataPointer<ProStringList> *)&local_58);
    }
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (ProString *)0x0;
    local_58.size = 0;
    VVar4 = expandVariableReferences(this,tokPtr,5,(ProStringList *)&local_58,true);
    VVar5 = ReturnError;
    if (VVar4 != ReturnError) {
      pSVar1 = (cVar14.i.d)->spans;
      uVar8 = cVar14.i.bucket >> 7;
      VVar5 = evaluateBuiltinExpand
                        (this,(QMakeBuiltin *)
                              (pSVar1[uVar8].entries
                               [pSVar1[uVar8].offsets[(uint)cVar14.i.bucket & 0x7f]].storage.data +
                              0x30),func,(ProStringList *)&local_58,ret);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar5;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateExpandFunction(
        const ProKey &func, const ushort *&tokPtr, ProStringList *ret)
{
    auto adef = statics.expands.constFind(func);
    if (adef != statics.expands.constEnd()) {
        //why don't the builtin functions just use args_list? --Sam
        ProStringList args;
        if (expandVariableReferences(tokPtr, 5, &args, true) == ReturnError)
            return ReturnError;
        return evaluateBuiltinExpand(*adef, func, args, *ret);
    }

    QHash<ProKey, ProFunctionDef>::ConstIterator it =
            m_functionDefs.replaceFunctions.constFind(func);
    if (it != m_functionDefs.replaceFunctions.constEnd()) {
        QList<ProStringList> args;
        if (prepareFunctionArgs(tokPtr, &args) == ReturnError)
            return ReturnError;
        traceMsg("calling $$%s(%s)", dbgKey(func), dbgStrListList(args));
        return evaluateFunction(*it, args, ret);
    }

    skipExpression(tokPtr);
    evalError(fL1S("'%1' is not a recognized replace function.").arg(func.toQStringView()));
    return ReturnFalse;
}